

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O1

void __thiscall
parcel_out_uniform_storage::handle_images
          (parcel_out_uniform_storage *this,glsl_type *base_type,gl_uniform_storage *uniform,
          char *name)

{
  byte bVar1;
  gl_program *pgVar2;
  GLenum GVar3;
  ulong uVar4;
  GLenum *pGVar5;
  uint uVar6;
  GLenum GVar7;
  bool bVar8;
  
  if (base_type->field_0x4 == '\r') {
    uniform->opaque[this->shader_type].active = true;
    uVar6 = *(uint *)&(this->current_var->data).field_0x4;
    bVar8 = (uVar6 >> 0xb & 1) != 0;
    GVar7 = 35000;
    if (bVar8) {
      GVar7 = 0;
    }
    GVar3 = 0x88ba - bVar8;
    if ((uVar6 >> 10 & 1) != 0) {
      GVar3 = GVar7;
    }
    if (((this->current_var->data).field_0x6 & 4) == 0) {
      bVar8 = set_opaque_indices(this,base_type,uniform,name,&this->next_image,
                                 this->record_next_image);
      if (bVar8) {
        bVar1 = uniform->opaque[this->shader_type].index;
        uVar4 = (ulong)bVar1;
        uVar6 = 0x20;
        if (this->next_image < 0x20) {
          uVar6 = this->next_image;
        }
        if (bVar1 < uVar6) {
          pgVar2 = this->prog->_LinkedShaders[this->shader_type]->Program;
          do {
            (pgVar2->field_20).sh.ImageAccess[uVar4] = (GLenum16)GVar3;
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar4);
        }
      }
    }
    else {
      bVar8 = set_opaque_indices(this,base_type,uniform,name,&this->next_bindless_image,
                                 this->record_next_bindless_image);
      if (bVar8) {
        this->num_bindless_images = this->next_bindless_image;
        pGVar5 = (GLenum *)realloc(this->bindless_access,(ulong)this->next_bindless_image << 2);
        this->bindless_access = pGVar5;
        bVar1 = uniform->opaque[this->shader_type].index;
        uVar4 = (ulong)bVar1;
        uVar6 = this->num_bindless_images;
        if (bVar1 < uVar6) {
          do {
            pGVar5[uVar4] = GVar3;
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar4);
        }
      }
    }
  }
  return;
}

Assistant:

bool is_image() const
   {
      return base_type == GLSL_TYPE_IMAGE;
   }